

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

_Bool flexfloat_round_bit(flexfloat_t *a,int_fast16_t exp)

{
  int iVar1;
  ulong uVar2;
  uint_t denorm;
  int shift;
  int_fast16_t exp_local;
  flexfloat_t *a_local;
  bool local_1;
  
  if ((exp < 1) && (((ulong)a->value >> 0x34 & 0x7ff) != 0)) {
    iVar1 = 1 - (int)exp;
    denorm = 0;
    if (iVar1 < 0x40) {
      denorm = ((ulong)a->value & 0xfffffffffffff | 0x10000000000000) >> ((byte)iVar1 & 0x3f);
    }
    uVar2 = denorm & 1L << (0x33 - (a->desc).frac_bits & 0x3f);
  }
  else {
    uVar2 = (ulong)a->value & 1L << (0x33 - (a->desc).frac_bits & 0x3f);
  }
  local_1 = uVar2 != 0;
  return local_1;
}

Assistant:

bool flexfloat_round_bit(const flexfloat_t *a, int_fast16_t exp)
{
    if(exp <= 0 && EXPONENT(CAST_TO_INT(a->value)) != 0)
    {
        int shift = (- exp + 1);
        uint_t denorm = 0;
        if(shift < NUM_BITS)
          denorm = ((CAST_TO_INT(a->value) & MASK_FRAC | MASK_FRAC_MSB)) >> shift;
        return denorm & (UINT_C(0x1) << (NUM_BITS_FRAC - a->desc.frac_bits - 1));
    }
    else
    {
        return CAST_TO_INT(a->value) & (UINT_C(0x1) << (NUM_BITS_FRAC - a->desc.frac_bits - 1));
    }
}